

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  time_t tVar5;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint local_9c;
  ulong local_98;
  int local_90;
  char local_88 [88];
  ulong uVar6;
  
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  al_set_org_name("liballeg.org");
  al_set_app_name("SPEED");
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    fwrite("Could not initialise Allegro.\n",0x1e,1,_stderr);
  }
  else {
    local_98 = 0;
    lVar9 = 1;
    al_init_primitives_addon();
    local_9c = 0x40;
    uVar10 = 0;
    local_90 = 0;
    while( true ) {
      iVar4 = (int)uVar10;
      if (argc <= lVar9) break;
      __s1 = argv[lVar9];
      iVar2 = strcmp(__s1,"-cheat");
      if (iVar2 == 0) {
        cheat = -1;
      }
      else {
        iVar2 = strcmp(__s1,"-simple");
        if (iVar2 == 0) {
          low_detail = -1;
        }
        else {
          iVar2 = strcmp(__s1,"-nogrid");
          if (iVar2 == 0) {
            no_grid = -1;
          }
          else {
            iVar2 = strcmp(__s1,"-nomusic");
            if (iVar2 == 0) {
              no_music = -1;
            }
            else {
              iVar2 = strcmp(__s1,"-www");
              if (iVar2 == 0) {
                local_90 = -1;
              }
              else {
                iVar2 = strcmp(__s1,"-fullscreen");
                if (iVar2 == 0) {
                  uVar3 = 2;
                  if ((int)local_98 == 0) {
                    uVar3 = 0x200;
                  }
                  local_9c = local_9c | uVar3;
                }
                else {
                  uVar3 = atoi(__s1);
                  uVar6 = (ulong)uVar3;
                  if (uVar3 == 0) goto LAB_0010845e;
                  if ((int)local_98 == 0) {
                    local_98 = uVar6;
                    if (local_9c >> 9 != 0) {
                      local_9c = local_9c & 0xfffffdfd | 2;
                    }
                  }
                  else {
                    uVar10 = uVar6;
                    if (iVar4 != 0) goto LAB_0010845e;
                  }
                }
              }
            }
          }
        }
      }
      lVar9 = lVar9 + 1;
    }
    if (local_90 == 0) {
      if ((int)local_98 == 0 || iVar4 == 0) {
        uVar10 = 0x1e0;
        local_98 = 0x280;
        if ((argc != 1) && ((local_9c & 0x200) == 0)) {
LAB_0010845e:
          usage();
          return 1;
        }
      }
      al_set_new_display_option(0x11,1,2);
      al_set_new_display_option(0x12,4,2);
      al_set_new_display_flags(local_9c);
      screen = (ALLEGRO_DISPLAY *)al_create_display(local_98,uVar10);
      if (screen == (ALLEGRO_DISPLAY *)0x0) {
        fprintf(_stderr,"Error setting %dx%d display mode\n",local_98,uVar10);
        return 1;
      }
      al_init_font_addon();
      al_set_new_bitmap_flags(1);
      font = (ALLEGRO_FONT *)al_create_builtin_font();
      if (font != (ALLEGRO_FONT *)0x0) {
        al_set_new_bitmap_flags(0x400);
        font_video = (ALLEGRO_FONT *)al_create_builtin_font();
        if (font_video != (ALLEGRO_FONT *)0x0) {
          al_install_keyboard();
          al_install_joystick();
          cVar1 = al_install_audio();
          if ((cVar1 != '\0') && (cVar1 = al_reserve_samples(8), cVar1 == '\0')) {
            al_uninstall_audio();
          }
          init_input();
          init_sound();
          init_hiscore();
          while (iVar4 = title_screen(), iVar4 != 0) {
            score = 0;
            iVar4 = 0;
            init_view();
            init_player();
            init_badguys();
            init_bullets();
            init_explode();
            init_message();
            uVar7 = al_create_timer(0x3f91111111111111);
            al_start_timer(uVar7);
            bVar11 = false;
            while (iVar4 == 0) {
              iVar4 = 0;
              while ((lVar9 = al_get_timer_count(uVar7), 0 < lVar9 && (iVar4 == 0))) {
                update_view();
                update_bullets();
                update_explode();
                update_message();
                iVar4 = update_badguys();
                if (iVar4 != 0) {
                  iVar2 = 0;
                  iVar4 = advance_view();
                  if (iVar4 != 0) {
                    al_set_timer_count(uVar7,0);
                    iVar2 = -1;
                  }
                  lay_attack_wave(iVar2);
                  advance_player(iVar2);
                }
                bVar11 = false;
                iVar4 = update_player();
                lVar9 = al_get_timer_count(uVar7);
                al_set_timer_count(uVar7,lVar9 + -1);
              }
              if (key[0x5c] != 0) {
                play_game_ss_count = play_game_ss_count + 1;
                sprintf(local_88,"speed%03d.tga");
                uVar8 = al_get_backbuffer(screen);
                al_save_bitmap(local_88,uVar8);
                while (key[0x5c] != 0) {
                  poll_input_wait();
                }
                al_set_timer_count(uVar7,0);
              }
              if (key[6] != 0) {
                uVar3 = al_get_display_flags(screen);
                al_set_display_flag(screen,0x200,(uVar3 >> 9 & 1) == 0);
                while (key[6] != 0) {
                  poll_input_wait();
                }
              }
              if (bVar11) {
                rest(1);
                bVar11 = true;
              }
              else {
                draw_view();
                bVar11 = true;
              }
            }
            al_destroy_timer(uVar7);
            shutdown_view();
            shutdown_player();
            shutdown_badguys();
            shutdown_bullets();
            shutdown_explode();
            shutdown_message();
            if (iVar4 < 0) {
              sfx_ping(1);
            }
            else {
              show_results();
              score_table();
            }
          }
          shutdown_hiscore();
          shutdown_sound();
          goodbye();
          shutdown_input();
          al_destroy_font(font);
          al_destroy_font(font_video);
          return 0;
        }
      }
      fwrite("Error creating builtin font\n",0x1c,1,_stderr);
      return 1;
    }
    puts(
        "\nUnfortunately the built-in web browser feature had to be removed.\n\nI did get it more or less working as of Saturday evening (forms and\nJava were unsupported, but tables and images were mostly rendering ok),\nbut the US Department of Justice felt that this was an unacceptable\nmonopolistic attempt to tie in web browsing functionality to an\nunrelated product, so they threatened me with being sniped at from\nthe top of tall buildings by guys with high powered rifles unless I\nagreed to disable this code.\n\nWe apologise for any inconvenience that this may cause you."
        );
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
   int w = 0, h = 0;
   int www = FALSE;
   int i, n;
   int display_flags = ALLEGRO_GENERATE_EXPOSE_EVENTS;

   srand(time(NULL));
   
   al_set_org_name("liballeg.org");
   al_set_app_name("SPEED");

   if (!al_init()) {
      fprintf(stderr, "Could not initialise Allegro.\n");
      return 1;
   }
   al_init_primitives_addon();

   /* parse the commandline */
   for (i=1; i<argc; i++) {
      if (strcmp(argv[i], "-cheat") == 0) {
         cheat = TRUE;
      }
      else if (strcmp(argv[i], "-simple") == 0) {
         low_detail = TRUE;
      }
      else if (strcmp(argv[i], "-nogrid") == 0) {
         no_grid = TRUE;
      }
      else if (strcmp(argv[i], "-nomusic") == 0) {
         no_music = TRUE;
      }
      else if (strcmp(argv[i], "-www") == 0) {
         www = TRUE;
      }
      else if (strcmp(argv[i], "-fullscreen") == 0) {
         /* if no width is specified, assume fullscreen_window */
         display_flags |= w ? ALLEGRO_FULLSCREEN : ALLEGRO_FULLSCREEN_WINDOW;
      }
      else {
         n = atoi(argv[i]);

         if (!n) {
            usage();
            return 1;
         }

         if (!w) {
            w = n;
            if (display_flags & ALLEGRO_FULLSCREEN_WINDOW) {
               /* toggle from fullscreen_window to fullscreen */
               display_flags &= ~ALLEGRO_FULLSCREEN_WINDOW;
               display_flags |= ALLEGRO_FULLSCREEN;
            }
         }
         else if (!h) {
            h = n;
         }
         else {
            usage();
            return 1;
         }
      }
   }

   /* it's a real shame that I had to take this out! */
   if (www) {
      printf(
	 "\n"
	 "Unfortunately the built-in web browser feature had to be removed.\n"
	 "\n"
	 "I did get it more or less working as of Saturday evening (forms and\n"
	 "Java were unsupported, but tables and images were mostly rendering ok),\n"
	 "but the US Department of Justice felt that this was an unacceptable\n"
	 "monopolistic attempt to tie in web browsing functionality to an\n"
	 "unrelated product, so they threatened me with being sniped at from\n"
	 "the top of tall buildings by guys with high powered rifles unless I\n"
	 "agreed to disable this code.\n"
	 "\n"
	 "We apologise for any inconvenience that this may cause you.\n"
      );

      return 1;
   }
   
   if (!w || !h) {
      if (argc == 1 || (display_flags & ALLEGRO_FULLSCREEN_WINDOW)) {
         w = 640;
         h = 480;
      }
      else {
         usage();
         return 1;
      }
   }

   /* set the screen mode */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 4, ALLEGRO_SUGGEST);

   al_set_new_display_flags(display_flags);
   screen = al_create_display(w, h);
   if (!screen) {
      fprintf(stderr, "Error setting %dx%d display mode\n", w, h);
      return 1;
   }

   /* To avoid performance problems on graphics drivers that don't support
    * drawing to textures, we build up transition screens on memory bitmaps.
    * We need a font loaded into a memory bitmap for those, then a font
    * loaded into a video bitmap for the game view. Blech!
    */
   al_init_font_addon();
   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   font = al_create_builtin_font();
   if (!font) {
      fprintf(stderr, "Error creating builtin font\n");
      return 1;
   }

   al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);
   font_video = al_create_builtin_font();
   if (!font_video) {
      fprintf(stderr, "Error creating builtin font\n");
      return 1;
   }

   /* set up everything else */
   al_install_keyboard();
   al_install_joystick();
   if (al_install_audio()) {
      if (!al_reserve_samples(8))
         al_uninstall_audio();
   }

   init_input();
   init_sound();
   init_hiscore();

   /* the main program body */
   while (title_screen()) {
      if (play_game()) {
	 show_results();
	 score_table();
      }
   }

   /* time to go away now */
   shutdown_hiscore();
   shutdown_sound();

   goodbye();

   shutdown_input();

   al_destroy_font(font);
   al_destroy_font(font_video);

   return 0;
}